

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

void ImageDrawRectangleLines(Image *dst,Rectangle rec,int thick,Color color)

{
  int width;
  int posX;
  int height;
  float fVar1;
  float fVar2;
  undefined4 uStack_74;
  
  fVar1 = rec.y;
  posX = (int)rec.x;
  width = (int)rec.width;
  ImageDrawRectangle(dst,posX,(int)fVar1,width,thick,color);
  fVar2 = (float)thick;
  uStack_74 = rec.height;
  height = (int)(uStack_74 - (float)(thick * 2));
  ImageDrawRectangle(dst,posX,(int)(fVar1 + fVar2),thick,height,color);
  ImageDrawRectangle(dst,(int)((rec.x + rec.width) - fVar2),(int)(fVar1 + fVar2),thick,height,color)
  ;
  ImageDrawRectangle(dst,posX,(int)((uStack_74 + fVar1) - fVar2),width,thick,color);
  return;
}

Assistant:

void ImageDrawRectangleLines(Image *dst, Rectangle rec, int thick, Color color)
{
    ImageDrawRectangle(dst, (int)rec.x, (int)rec.y, (int)rec.width, thick, color);
    ImageDrawRectangle(dst, (int)rec.x, (int)(rec.y + thick), thick, (int)(rec.height - thick*2), color);
    ImageDrawRectangle(dst, (int)(rec.x + rec.width - thick), (int)(rec.y + thick), thick, (int)(rec.height - thick*2), color);
    ImageDrawRectangle(dst, (int)rec.x, (int)(rec.y + rec.height - thick), (int)rec.width, thick, color);
}